

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_rds_describe_realtime_diagnoses.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1590ba::Json2Array<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>
::Json2Array(Json2Array<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType> *this,
            Value *value,
            vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
            *vec)

{
  undefined4 uVar1;
  bool bVar2;
  ArrayIndex AVar3;
  Value *value_00;
  undefined1 local_a8 [8];
  RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType val;
  int i;
  vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
  *vec_local;
  Value *value_local;
  Json2Array<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType> *this_local;
  
  bVar2 = Json::Value::isArray(value);
  if (bVar2) {
    for (val.status.field_2._12_4_ = 0; uVar1 = val.status.field_2._12_4_,
        AVar3 = Json::Value::size(value), (uint)uVar1 < AVar3;
        val.status.field_2._12_4_ = val.status.field_2._12_4_ + 1) {
      aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType::
      RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType
                ((RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *)local_a8);
      value_00 = Json::Value::operator[](value,val.status.field_2._12_4_);
      anon_unknown.dwarf_1590ba::Json2Type
                (value_00,(RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *)local_a8);
      std::
      vector<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType,_std::allocator<aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType>_>
      ::push_back(vec,(value_type *)local_a8);
      aliyun::RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType::
      ~RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType
                ((RdsDescribeRealtimeDiagnosesRealtimeDiagnoseTasksType *)local_a8);
    }
  }
  return;
}

Assistant:

Json2Array(const Json::Value& value, std::vector<T>* vec) {
    if(!value.isArray()) {
      return;
    }
    for(int i = 0; i < value.size(); i++) {
      T val;
      Json2Type(value[i], &val);
      vec->push_back(val);
    }
  }